

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docking-data.cpp
# Opt level: O2

ostream * operator<<(ostream *os,vm<value_mask_strategy> *machine)

{
  ostream *poVar1;
  _Variant_storage<false,_std::monostate,_update_bitmask,_write_memory> _Stack_48;
  
  poVar1 = std::operator<<(os,"VM (mask: ");
  std::__detail::__variant::_Variant_storage<false,std::monostate,update_bitmask,write_memory>::
  _Variant_storage<1ul,update_bitmask_const&>
            ((_Variant_storage<false,std::monostate,update_bitmask,write_memory> *)&_Stack_48,
             &machine->mask);
  operator<<(poVar1,(instruction_t *)&_Stack_48);
  poVar1 = std::operator<<(poVar1,", memory: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," elements sum to ");
  vm<address_decoder_strategy>::sum((vm<address_decoder_strategy> *)machine);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,")");
  std::__detail::__variant::_Variant_storage<false,_std::monostate,_update_bitmask,_write_memory>::
  ~_Variant_storage(&_Stack_48);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const vm<S>& machine) {
  os << "VM (mask: " << machine.mask << ", memory: " << machine.mem.size() << " elements sum to " << machine.sum() << ")";
  return os;
}